

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  bool bVar1;
  long lVar2;
  runtime_error *this_00;
  long in_RDI;
  size_t semicolon_1;
  size_t semicolon;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string local_88 [40];
  string local_60 [48];
  string local_30 [44];
  metric_name local_4;
  
  std::__cxx11::string::substr((ulong)local_30,in_RDI + 0x148);
  bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    local_4 = f1scoreLabel;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (bVar1) {
      local_4 = f1score;
    }
    else {
      std::__cxx11::string::substr((ulong)local_60,in_RDI + 0x148);
      bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_60);
      if (bVar1) {
        lVar2 = std::__cxx11::string::find((char *)(in_RDI + 0x148),0x1e4d2b);
        if (lVar2 == -1) {
          local_4 = precisionAtRecall;
        }
        else {
          local_4 = precisionAtRecallLabel;
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_88,in_RDI + 0x148);
        bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        std::__cxx11::string::~string(local_88);
        if (!bVar1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffff50);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar2 = std::__cxx11::string::find((char *)(in_RDI + 0x148),0x1e4d2b);
        if (lVar2 == -1) {
          local_4 = recallAtPrecision;
        }
        else {
          local_4 = recallAtPrecisionLabel;
        }
      }
    }
  }
  return local_4;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::f1scoreLabel;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  } else if (autotuneMetric.substr(0, 18) == "precisionAtRecall:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::precisionAtRecallLabel;
    }
    return metric_name::precisionAtRecall;
  } else if (autotuneMetric.substr(0, 18) == "recallAtPrecision:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::recallAtPrecisionLabel;
    }
    return metric_name::recallAtPrecision;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}